

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O2

void u_enumCharTypes_63(UCharEnumTypeRange *enumRange,void *context)

{
  _EnumTypeCallback callback;
  UCharEnumTypeRange *local_10;
  void *local_8;
  
  if (enumRange != (UCharEnumTypeRange *)0x0) {
    local_10 = enumRange;
    local_8 = context;
    utrie2_enum_63(&propsTrie,_enumTypeValue,_enumTypeRange,&local_10);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_enumCharTypes(UCharEnumTypeRange *enumRange, const void *context) {
    struct _EnumTypeCallback callback;

    if(enumRange==NULL) {
        return;
    }

    callback.enumRange=enumRange;
    callback.context=context;
    utrie2_enum(&propsTrie, _enumTypeValue, _enumTypeRange, &callback);
}